

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O1

uint Gia_LutDelayTraceTCEdges(Gia_Man_t *p,int iObj,float tDelta)

{
  uint *puVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  float *pfVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  int pPinPerm [32];
  float pPinDelays [32];
  int local_128 [32];
  float local_a8 [32];
  
  if (-1 < iObj) {
    uVar12 = iObj * 3 + 1;
    uVar10 = p->vTiming->nSize;
    if ((int)uVar12 < (int)uVar10) {
      pvVar6 = p->pLutLib;
      pfVar7 = p->vTiming->pArray;
      fVar2 = pfVar7[uVar12];
      if (pvVar6 == (void *)0x0) {
        iVar3 = p->vMapping->nSize;
        if (iObj < iVar3) {
          piVar9 = p->vMapping->pArray;
          uVar12 = piVar9[(uint)iObj];
          if ((-1 < (int)uVar12) && ((int)uVar12 < iVar3)) {
            puVar1 = (uint *)(piVar9 + uVar12);
            uVar12 = *puVar1;
            uVar17 = 0;
            uVar13 = (ulong)uVar12;
            if ((int)uVar12 < 1) {
              uVar13 = uVar17;
            }
            uVar12 = 0;
            do {
              if (uVar13 == uVar17) {
                return uVar12;
              }
              uVar18 = puVar1[uVar17 + 1];
              if (((int)uVar18 < 0) ||
                 (uVar16 = uVar18 * 3,
                 uVar10 == uVar16 || SBORROW4(uVar10,uVar16) != (int)(uVar10 + uVar18 * -3) < 0))
              goto LAB_0071c41f;
              uVar18 = 1 << ((byte)uVar17 & 0x1f);
              if (pfVar7[uVar16] + 1.0 + tDelta <= fVar2) {
                uVar18 = 0;
              }
              uVar12 = uVar12 | uVar18;
              uVar17 = uVar17 + 1;
            } while (iObj < iVar3);
          }
        }
      }
      else {
        pVVar8 = p->vMapping;
        iVar3 = pVVar8->nSize;
        if (*(int *)((long)pvVar6 + 0xc) == 0) {
          if (iObj < iVar3) {
            piVar9 = pVVar8->pArray;
            lVar15 = (long)piVar9[(uint)iObj];
            if ((-1 < lVar15) && (piVar9[(uint)iObj] < iVar3)) {
              lVar14 = (long)piVar9[lVar15];
              if (lVar14 < 1) {
                uVar12 = 0;
              }
              else {
                lVar11 = 0;
                uVar12 = 0;
                do {
                  iVar3 = piVar9[lVar15 + lVar11 + 1];
                  if ((iVar3 < 0) ||
                     (uVar18 = iVar3 * 3,
                     uVar10 == uVar18 || SBORROW4(uVar10,uVar18) != (int)(uVar10 + iVar3 * -3) < 0))
                  goto LAB_0071c41f;
                  uVar16 = 1 << ((byte)lVar11 & 0x1f);
                  if (pfVar7[uVar18] + *(float *)((long)pvVar6 + lVar14 * 0x84 + 0x94) + tDelta <=
                      fVar2) {
                    uVar16 = 0;
                  }
                  uVar12 = uVar12 | uVar16;
                  lVar11 = lVar11 + 1;
                } while (lVar14 != lVar11);
              }
              return uVar12;
            }
          }
        }
        else if (iObj < iVar3) {
          iVar4 = pVVar8->pArray[(uint)iObj];
          if ((-1 < (long)iVar4) && (iVar4 < iVar3)) {
            iVar3 = pVVar8->pArray[iVar4];
            Gia_LutDelayTraceSortPins(p,iObj,local_128,local_a8);
            iVar4 = p->vMapping->nSize;
            if (iObj < iVar4) {
              piVar9 = p->vMapping->pArray;
              iVar5 = piVar9[(uint)iObj];
              if ((-1 < (long)iVar5) && (iVar5 < iVar4)) {
                puVar1 = (uint *)(piVar9 + iVar5);
                uVar10 = *puVar1;
                uVar13 = (ulong)uVar10;
                if ((int)uVar10 < 1) {
                  uVar13 = 0;
                }
                uVar17 = 0;
                uVar10 = 0;
                do {
                  if (uVar13 == uVar17) {
                    return uVar10;
                  }
                  uVar12 = puVar1[(long)local_128[uVar17] + 1];
                  if ((int)uVar12 < 0) goto LAB_0071c41f;
                  uVar16 = uVar12 * 3;
                  uVar18 = p->vTiming->nSize;
                  if (uVar18 == uVar16 || SBORROW4(uVar18,uVar16) != (int)(uVar18 + uVar12 * -3) < 0
                     ) goto LAB_0071c41f;
                  uVar12 = 1 << ((byte)local_128[uVar17] & 0x1f);
                  if (p->vTiming->pArray[uVar16] +
                      *(float *)((long)pvVar6 + uVar17 * 4 + (long)iVar3 * 0x84 + 0x94) + tDelta <=
                      fVar2) {
                    uVar12 = 0;
                  }
                  uVar10 = uVar10 | uVar12;
                  uVar17 = uVar17 + 1;
                } while (iObj < iVar4);
              }
            }
          }
        }
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
  }
LAB_0071c41f:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecFlt.h"
                ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
}

Assistant:

unsigned Gia_LutDelayTraceTCEdges( Gia_Man_t * p, int iObj, float tDelta )
{
    If_LibLut_t * pLutLib = (If_LibLut_t *)p->pLutLib;
    int pPinPerm[32];
    float pPinDelays[32];
    float tRequired, * pDelays;
    unsigned uResult = 0;
    int k, iFanin;
    tRequired = Gia_ObjTimeRequired( p, iObj );
    if ( pLutLib == NULL )
    {
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( tRequired < Gia_ObjTimeArrival(p, iFanin) + 1.0 + tDelta )
                uResult |= (1 << k);
    }
    else if ( !pLutLib->fVarPinDelays )
    {
        pDelays = pLutLib->pLutDelays[Gia_ObjLutSize(p, iObj)];
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( tRequired < Gia_ObjTimeArrival(p, iFanin) + pDelays[0] + tDelta )
                uResult |= (1 << k);
    }
    else
    {
        pDelays = pLutLib->pLutDelays[Gia_ObjLutSize(p, iObj)];
        Gia_LutDelayTraceSortPins( p, iObj, pPinPerm, pPinDelays );
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( tRequired < Gia_ObjTimeArrival( p, Gia_ObjLutFanin(p, iObj,pPinPerm[k])) + pDelays[k] + tDelta )
                uResult |= (1 << pPinPerm[k]);
    }
    return uResult;
}